

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.hpp
# Opt level: O2

bool httplib::detail::is_valid_path(string *path)

{
  int iVar1;
  pointer pcVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  
  pcVar2 = (path->_M_dataplus)._M_p;
  uVar8 = path->_M_string_length;
  for (uVar3 = 0; (uVar4 = uVar8, uVar8 != uVar3 && (uVar4 = uVar3, pcVar2[uVar3] == '/'));
      uVar3 = uVar3 + 1) {
  }
  lVar5 = 0;
  while (uVar3 = uVar4, uVar4 < uVar8) {
    for (; (uVar7 = uVar8, uVar8 != uVar3 && (uVar7 = uVar3, pcVar2[uVar3] != '/'));
        uVar3 = uVar3 + 1) {
    }
    pcVar6 = (char *)(uVar7 - uVar4);
    if (pcVar6 == (char *)0x0) {
      __assert_fail("len > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/httplib/httplib.hpp"
                    ,0x5d0,"bool httplib::detail::is_valid_path(const std::string &)");
    }
    iVar1 = std::__cxx11::string::compare((ulong)path,uVar4,pcVar6);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((ulong)path,uVar4,pcVar6);
      if (iVar1 == 0) {
        if (lVar5 == 0) break;
        lVar5 = lVar5 + -1;
      }
      else {
        lVar5 = lVar5 + 1;
      }
    }
    pcVar2 = (path->_M_dataplus)._M_p;
    uVar8 = path->_M_string_length;
    uVar3 = uVar8;
    if (uVar8 < uVar7) {
      uVar3 = uVar7;
    }
    for (; (uVar4 = uVar3, uVar3 != uVar7 && (uVar4 = uVar7, pcVar2[uVar7] == '/'));
        uVar7 = uVar7 + 1) {
    }
  }
  return uVar8 <= uVar4;
}

Assistant:

inline bool is_valid_path(const std::string& path) {
            size_t level = 0;
            size_t i = 0;

            // Skip slash
            while (i < path.size() && path[i] == '/') {
                i++;
            }

            while (i < path.size()) {
                // Read component
                auto beg = i;
                while (i < path.size() && path[i] != '/') {
                    i++;
                }

                auto len = i - beg;
                assert(len > 0);

                if (!path.compare(beg, len, ".")) {
                    ;
                }
                else if (!path.compare(beg, len, "..")) {
                    if (level == 0) { return false; }
                    level--;
                }
                else {
                    level++;
                }

                // Skip slash
                while (i < path.size() && path[i] == '/') {
                    i++;
                }
            }

            return true;
        }